

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators,
          bool includeNamesWithPlatform)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pbVar1;
  int iVar2;
  undefined7 in_register_00000011;
  pointer puVar3;
  _Alloc_hider _Var4;
  string *a;
  pointer pbVar5;
  GeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_160 [32];
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined2 local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  bool local_c0;
  undefined1 local_b8 [40];
  pointer local_90;
  pointer local_88;
  string *local_80;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_58;
  cmake *local_38;
  
  local_88 = (pointer)CONCAT44(local_88._4_4_,
                               (int)CONCAT71(in_register_00000011,includeNamesWithPlatform));
  puVar3 = (this->Generators).
           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (this->Generators).
             super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = generators;
  local_38 = this;
  if (puVar3 != local_90) {
    do {
      (*((puVar3->_M_t).
         super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
         .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
        _vptr_cmGlobalGeneratorFactory[4])(&local_58);
      if ((char)local_88 != '\0') {
        (*((puVar3->_M_t).
           super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
           .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
          _vptr_cmGlobalGeneratorFactory[5])(local_160);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   local_58._M_string_length,local_160._0_8_,local_160._8_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_160);
      }
      local_80 = (string *)local_58._M_string_length;
      _Var4._M_p = local_58._M_dataplus._M_p;
      if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
        do {
          local_160._0_8_ = local_160 + 0x10;
          local_160._8_8_ = (pointer)0x0;
          local_160[0x10] = '\0';
          local_140._M_p = (pointer)&local_130;
          local_138 = 0;
          local_130._M_local_buf[0] = '\0';
          local_120._M_p = (pointer)&local_110;
          local_118 = 0;
          local_110._M_local_buf[0] = '\0';
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e0._M_p = (pointer)&local_d0;
          local_d8 = 0;
          local_d0._M_local_buf[0] = '\0';
          iVar2 = (*((puVar3->_M_t).
                     super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                     .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
                    _vptr_cmGlobalGeneratorFactory[6])();
          local_100._0_1_ = SUB41(iVar2,0);
          iVar2 = (*((puVar3->_M_t).
                     super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                     .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
                    _vptr_cmGlobalGeneratorFactory[7])();
          local_100._1_1_ = SUB41(iVar2,0);
          (*((puVar3->_M_t).
             super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
             .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
            _vptr_cmGlobalGeneratorFactory[8])(&local_70);
          local_b8._16_8_ =
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_b8._8_8_ =
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_b8._0_8_ =
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_70.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_70.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_70.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
          local_70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
          local_70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_70);
          (*((puVar3->_M_t).
             super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
             .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
            _vptr_cmGlobalGeneratorFactory[9])((string *)local_b8);
          std::__cxx11::string::operator=((string *)&local_e0,(string *)local_b8);
          if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
          }
          std::__cxx11::string::_M_assign((string *)local_160);
          std::__cxx11::string::_M_assign((string *)(local_160 + 0x20));
          local_c0 = false;
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
          emplace_back<cmake::GeneratorInfo>(local_78,(GeneratorInfo *)local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_p != &local_d0) {
            operator_delete(local_e0._M_p,
                            CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0])
                            + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_p != &local_110) {
            operator_delete(local_120._M_p,
                            CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_p != &local_130) {
            operator_delete(local_140._M_p,
                            CONCAT71(local_130._M_allocated_capacity._1_7_,local_130._M_local_buf[0]
                                    ) + 1);
          }
          if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
            operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
          }
          _Var4._M_p = _Var4._M_p + 0x20;
        } while ((string *)_Var4._M_p != local_80);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_90);
  }
  local_88 = (local_38->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (pointer)(local_38->ExtraGenerators).
                      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)local_88 != local_90) {
    do {
      this_00 = *local_88;
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_70,this_00);
      local_80 = local_70.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pbVar5 = local_70.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_160._0_8_ = local_160 + 0x10;
          local_160._8_8_ = (pointer)0x0;
          local_160[0x10] = '\0';
          local_140._M_p = (pointer)&local_130;
          local_138 = 0;
          local_130._M_local_buf[0] = '\0';
          local_120._M_p = (pointer)&local_110;
          local_118 = 0;
          local_110._M_local_buf[0] = '\0';
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
          local_d8 = 0;
          local_d0._M_local_buf[0] = '\0';
          local_e0._M_p = (pointer)&local_d0;
          cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_58,this_00);
          cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                    ((string *)local_b8,pbVar5,&local_58);
          std::__cxx11::string::operator=((string *)local_160,(string *)local_b8);
          if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_assign((string *)(local_160 + 0x20));
          cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)local_b8,this_00);
          std::__cxx11::string::operator=((string *)&local_120,(string *)local_b8);
          if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
          }
          local_100._0_1_ = false;
          local_100._1_1_ = false;
          local_c0 = false;
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
          emplace_back<cmake::GeneratorInfo>(local_78,(GeneratorInfo *)local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_p != &local_d0) {
            operator_delete(local_e0._M_p,
                            CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0])
                            + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_p != &local_110) {
            operator_delete(local_120._M_p,
                            CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_p != &local_130) {
            operator_delete(local_140._M_p,
                            CONCAT71(local_130._M_allocated_capacity._1_7_,local_130._M_local_buf[0]
                                    ) + 1);
          }
          if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
            operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != local_80);
      }
      pbVar1 = (this_00->Aliases).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = (this_00->Aliases).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        local_160._0_8_ = local_160 + 0x10;
        local_160._8_8_ = (pointer)0x0;
        local_160[0x10] = '\0';
        local_140._M_p = (pointer)&local_130;
        local_138 = 0;
        local_130._M_local_buf[0] = '\0';
        local_120._M_p = (pointer)&local_110;
        local_118 = 0;
        local_110._M_local_buf[0] = '\0';
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_d8 = 0;
        local_d0._M_local_buf[0] = '\0';
        local_e0._M_p = (pointer)&local_d0;
        std::__cxx11::string::_M_assign((string *)local_160);
        if (local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_70.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)(local_160 + 0x20));
        }
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)local_b8,this_00);
        std::__cxx11::string::operator=((string *)&local_120,(string *)local_b8);
        if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
        }
        local_100._0_1_ = false;
        local_100._1_1_ = false;
        local_c0 = true;
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
        emplace_back<cmake::GeneratorInfo>(local_78,(GeneratorInfo *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_p != &local_d0) {
          operator_delete(local_e0._M_p,
                          CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]) +
                          1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_p != &local_110) {
          operator_delete(local_120._M_p,
                          CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_p != &local_130) {
          operator_delete(local_140._M_p,
                          CONCAT71(local_130._M_allocated_capacity._1_7_,local_130._M_local_buf[0])
                          + 1);
        }
        if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
          operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
      local_88 = local_88 + 1;
    } while ((pointer)local_88 != local_90);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(std::vector<GeneratorInfo>& generators,
                                    bool includeNamesWithPlatform) const
{
  for (const auto& gen : this->Generators) {
    std::vector<std::string> names = gen->GetGeneratorNames();

    if (includeNamesWithPlatform) {
      cm::append(names, gen->GetGeneratorNamesWithPlatform());
    }

    for (std::string const& name : names) {
      GeneratorInfo info;
      info.supportsToolset = gen->SupportsToolset();
      info.supportsPlatform = gen->SupportsPlatform();
      info.supportedPlatforms = gen->GetKnownPlatforms();
      info.defaultPlatform = gen->GetDefaultPlatformName();
      info.name = name;
      info.baseName = name;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
  }

  for (cmExternalMakefileProjectGeneratorFactory* eg : this->ExtraGenerators) {
    const std::vector<std::string> genList =
      eg->GetSupportedGlobalGenerators();
    for (std::string const& gen : genList) {
      GeneratorInfo info;
      info.name = cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
        gen, eg->GetName());
      info.baseName = gen;
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
    for (std::string const& a : eg->Aliases) {
      GeneratorInfo info;
      info.name = a;
      if (!genList.empty()) {
        info.baseName = genList.at(0);
      }
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = true;
      generators.push_back(std::move(info));
    }
  }
}